

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
JsUtil::
List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
::EnsureArray(List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *this,int32 requiredCapacity)

{
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_> *src;
  bool bVar1;
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_> **ppWVar2;
  int *piVar3;
  Type *pTVar4;
  Type *oldbuffer;
  Type *newbuffer;
  int32 local_20;
  int32 oldBufferSize;
  int32 newBufferSize;
  int32 newLength;
  int32 newSize;
  int32 requiredCapacity_local;
  List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_local;
  
  newLength = requiredCapacity;
  _newSize = this;
  ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)
                       &(this->
                        super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                        ).buffer);
  if (*ppWVar2 == (WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_> *)0x0
     ) {
    piVar3 = max<int>(&newLength,&this->increment);
    newBufferSize = *piVar3;
    pTVar4 = AllocArray(this,newBufferSize);
    Memory::
    WriteBarrierPtr<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_>_>
    ::operator=(&(this->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer,pTVar4);
    (this->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
    ).count = 0;
    this->length = newBufferSize;
  }
  else if (((this->
            super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
            ).count == this->length) || (this->length < newLength)) {
    oldBufferSize = 0;
    local_20 = 0;
    newbuffer._4_4_ = 0;
    bVar1 = Int32Math::Add(this->length,1,&oldBufferSize);
    if ((bVar1) || (bVar1 = Int32Math::Shl(oldBufferSize,1,&oldBufferSize), bVar1)) {
      ExternalApi::RaiseOnIntOverflow();
    }
    piVar3 = max<int>(&newLength,&oldBufferSize);
    oldBufferSize = *piVar3;
    bVar1 = Int32Math::Mul(8,oldBufferSize,&local_20);
    if ((bVar1) || (bVar1 = Int32Math::Mul(8,this->length,(int32 *)((long)&newbuffer + 4)), bVar1))
    {
      ExternalApi::RaiseOnIntOverflow();
    }
    pTVar4 = AllocArray(this,oldBufferSize);
    ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)
                         &(this->
                          super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                          ).buffer);
    src = *ppWVar2;
    Memory::
    CopyArray<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>>,Memory::RecyclerNonLeafAllocator>
              (pTVar4,(long)oldBufferSize,src,(long)this->length);
    FreeArray(this,src,newbuffer._4_4_);
    this->length = oldBufferSize;
    Memory::
    WriteBarrierPtr<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_>_>
    ::operator=(&(this->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer,pTVar4);
  }
  return;
}

Assistant:

void EnsureArray(DECLSPEC_GUARD_OVERFLOW int32 requiredCapacity)
        {
            if (this->buffer == nullptr)
            {
                int32 newSize = max(requiredCapacity, increment);

                this->buffer = AllocArray(newSize);
                this->count = 0;
                this->length = newSize;
            }
            else if (this->count == length || requiredCapacity > this->length)
            {
                int32 newLength = 0, newBufferSize = 0, oldBufferSize = 0;

                if (Int32Math::Add(length, 1u, &newLength)
                    || Int32Math::Shl(newLength, 1u, &newLength))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                newLength = max(requiredCapacity, newLength);

                if (Int32Math::Mul(sizeof(T), newLength, &newBufferSize)
                    || Int32Math::Mul(sizeof(T), length, &oldBufferSize))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                Field(T, TAllocator)* newbuffer = AllocArray(newLength);
                Field(T, TAllocator)* oldbuffer = this->buffer;
                CopyArray<Field(T, TAllocator), Field(T, TAllocator), EffectiveAllocatorType>(
                    newbuffer, newLength, oldbuffer, length);

                FreeArray(oldbuffer, oldBufferSize);

                this->length = newLength;
                this->buffer = newbuffer;
            }
        }